

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OverviewExamples.cpp
# Opt level: O2

ostream * operator<<(ostream *os,Sandwich *sandwich)

{
  ostream *poVar1;
  string local_40;
  
  std::operator<<(os,"sandwich {\n");
  poVar1 = std::operator<<(os,"    bread: \"");
  poVar1 = std::operator<<(poVar1,(string *)sandwich);
  std::operator<<(poVar1,"\",\n");
  poVar1 = std::operator<<(os,"    condiments: ");
  StringList::toString_abi_cxx11_(&local_40,&sandwich->condiments);
  poVar1 = std::operator<<(poVar1,(string *)&local_40);
  std::operator<<(poVar1,",\n");
  std::__cxx11::string::~string((string *)&local_40);
  poVar1 = std::operator<<(os,"    fillings: ");
  StringList::toString_abi_cxx11_(&local_40,&sandwich->fillings);
  poVar1 = std::operator<<(poVar1,(string *)&local_40);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_40);
  std::operator<<(os,"}");
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const Sandwich& sandwich)
{
    os << "sandwich {\n";
    os << "    bread: \"" << sandwich.bread << "\",\n";
    os << "    condiments: " << sandwich.condiments.toString() << ",\n";
    os << "    fillings: " << sandwich.fillings.toString() << "\n";
    os << "}";
    return os;
}